

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls1_prf.c
# Opt level: O0

void kdf_tls1_prf_reset(void *vctx)

{
  char *in_RDI;
  void *provctx;
  TLS1_PRF *ctx;
  undefined8 uVar1;
  char *num;
  
  uVar1 = *(undefined8 *)in_RDI;
  num = in_RDI;
  EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32d2fd);
  EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32d30b);
  CRYPTO_clear_free(provctx,(size_t)num,in_RDI,(int)((ulong)uVar1 >> 0x20));
  OPENSSL_cleanse(in_RDI + 0x28,*(size_t *)(in_RDI + 0x428));
  memset(in_RDI,0,0x430);
  *(undefined8 *)in_RDI = uVar1;
  return;
}

Assistant:

static void kdf_tls1_prf_reset(void *vctx)
{
    TLS1_PRF *ctx = (TLS1_PRF *)vctx;
    void *provctx = ctx->provctx;

    EVP_MAC_CTX_free(ctx->P_hash);
    EVP_MAC_CTX_free(ctx->P_sha1);
    OPENSSL_clear_free(ctx->sec, ctx->seclen);
    OPENSSL_cleanse(ctx->seed, ctx->seedlen);
    memset(ctx, 0, sizeof(*ctx));
    ctx->provctx = provctx;
}